

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

array_container_t * array_container_from_run(run_container_t *arr)

{
  ushort uVar1;
  rle16_t *prVar2;
  uint16_t *puVar3;
  int iVar4;
  array_container_t *paVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  uint16_t uVar10;
  
  iVar4 = run_container_cardinality(arr);
  paVar5 = array_container_create_given_capacity(iVar4);
  paVar5->cardinality = 0;
  iVar4 = arr->n_runs;
  if (0 < (long)iVar4) {
    prVar2 = arr->runs;
    puVar3 = paVar5->array;
    lVar6 = 0;
    lVar8 = 0;
    do {
      uVar10 = prVar2[lVar6].value;
      uVar1 = prVar2[lVar6].length;
      iVar7 = (int)lVar8;
      lVar8 = (long)iVar7;
      uVar9 = 0;
      do {
        puVar3[lVar8] = uVar10;
        lVar8 = lVar8 + 1;
        uVar9 = uVar9 - 1;
        uVar10 = uVar10 + 1;
      } while (~(uint)uVar1 != uVar9);
      lVar6 = lVar6 + 1;
    } while (lVar6 != iVar4);
    paVar5->cardinality = iVar7 - uVar9;
  }
  return paVar5;
}

Assistant:

array_container_t *array_container_from_run(const run_container_t *arr) {
    array_container_t *answer =
        array_container_create_given_capacity(run_container_cardinality(arr));
    answer->cardinality = 0;
    for (int rlepos = 0; rlepos < arr->n_runs; ++rlepos) {
        int run_start = arr->runs[rlepos].value;
        int run_end = run_start + arr->runs[rlepos].length;

        for (int run_value = run_start; run_value <= run_end; ++run_value) {
            answer->array[answer->cardinality++] = (uint16_t)run_value;
        }
    }
    return answer;
}